

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvp.h
# Opt level: O2

void __thiscall
hiberlite::sql_nvp<std::pair<int,_double>_>::sql_nvp
          (sql_nvp<std::pair<int,_double>_> *this,string *_name,pair<int,_double> *_value,
          string *search)

{
  std::__cxx11::string::string((string *)this,(string *)_name);
  this->value = _value;
  std::__cxx11::string::string((string *)&this->search_key,(string *)search);
  return;
}

Assistant:

sql_nvp(std::string _name, C& _value, std::string search="") : name(_name), value(_value), search_key(search) {}